

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O2

MPP_RET jpegd_parse(void *ctx,HalDecTask *task)

{
  undefined *puVar1;
  undefined *puVar2;
  MppBufSlots slots;
  MppFrame s;
  RK_U8 *pRVar3;
  MPP_RET MVar4;
  byte bVar5;
  RK_U16 RVar6;
  MPP_RET MVar7;
  void *pvVar8;
  size_t sVar9;
  char cVar10;
  char *pcVar11;
  char *pcVar12;
  ushort uVar13;
  uint uVar14;
  BitReadCtx_t *pBVar15;
  long lVar16;
  ulong uVar17;
  MppFrameFormat v;
  long lVar18;
  long lVar19;
  uint uVar20;
  BitReadCtx_t *pBVar21;
  int iVar22;
  RK_U8 *pRVar23;
  BitReadCtx_t *pBVar24;
  RK_S32 RVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  RK_S32 _out;
  long local_b0;
  void *local_a8;
  uint local_9c;
  BitReadCtx_t *local_98;
  ulong local_90;
  long local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  long local_68;
  RK_U8 *local_60;
  RK_U8 *local_58;
  HalDecTask *local_50;
  RK_U8 *local_48;
  BitReadCtx_t *local_40;
  undefined4 local_34;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_parse");
  }
  task->valid = 0;
  local_50 = task;
  pvVar8 = mpp_packet_get_data(*(MppPacket *)((long)ctx + 0x28));
  *(void **)((long)ctx + 0x50) = pvVar8;
  memset(*(void **)((long)ctx + 0x68),0,0x930);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_decode_frame");
  }
  pRVar23 = *(RK_U8 **)((long)ctx + 0x50);
  uVar14 = *(uint *)((long)ctx + 0x20);
  pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
  lVar16 = *(long *)((long)ctx + 0x68);
  *(undefined2 *)(lVar16 + 0x929) = 0;
  if ((7 < (ulong)uVar14) && (pvVar8 = memchr(pRVar23,0xffd8,8), pvVar8 != (void *)0x0)) {
    local_60 = pRVar23 + uVar14;
    local_58 = local_60 + 1;
    local_b0 = lVar16;
    local_a8 = ctx;
    local_48 = pRVar23;
    local_40 = pBVar21;
LAB_001b0cb9:
    pRVar3 = local_60;
    pBVar21 = (BitReadCtx_t *)0x0;
    if (pRVar23 < local_60) {
      iVar22 = (int)pRVar23;
      iVar27 = (int)local_58;
      do {
        if (pRVar3 <= pRVar23) {
LAB_001b1f5a:
          pBVar21 = (BitReadCtx_t *)0xfffffc14;
          lVar16 = local_b0;
          if ((jpegd_debug & 2) != 0) {
            _mpp_log_l(4,"jpegd_parser","start code not found\n",(char *)0x0);
            lVar16 = local_b0;
          }
          break;
        }
        pvVar8 = memchr(pRVar23,0xff,(ulong)(uint)(iVar27 - iVar22));
        if (pvVar8 == (void *)0x0) {
          _mpp_log_l(2,"jpegd_parser","Start codec not found!\n",(char *)0x0);
          goto LAB_001b1f5a;
        }
        bVar5 = *(byte *)((long)pvVar8 + 1);
        uVar30 = (ulong)bVar5;
        if (0xc0 < (byte)(bVar5 + 1)) goto LAB_001b0d37;
        if ((jpegd_debug & 2) != 0) {
          _mpp_log_l(4,"jpegd_parser","0x%x is not a marker\n",(char *)0x0);
        }
        pRVar23 = pRVar23 + 1;
      } while( true );
    }
    goto LAB_001b1f8b;
  }
LAB_001b26f3:
  MVar7 = MPP_ERR_STREAM;
  MVar4 = MPP_ERR_STREAM;
  if ((jpegd_debug & 1) != 0) {
LAB_001b2705:
    MVar7 = MVar4;
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_decode_frame");
LAB_001b2724:
    if (MVar7 == MPP_OK) {
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_allocate_frame");
      }
      lVar16 = *(long *)((long)ctx + 0x68);
      slots = *(MppBufSlots *)((long)ctx + 8);
      s = *(MppFrame *)((long)ctx + 0x30);
      _out = *(int *)((long)ctx + 0x10);
      if (_out == -1) {
        v = MPP_FMT_YUV420SP;
        if ((ulong)*(uint *)(lVar16 + 0x894) < 5) {
          v = *(MppFrameFormat *)(&DAT_0027d7a4 + (ulong)*(uint *)(lVar16 + 0x894) * 4);
        }
        mpp_frame_set_fmt(s,v);
        mpp_frame_set_width(s,*(RK_U32 *)(lVar16 + 0x8c0));
        mpp_frame_set_height(s,*(RK_U32 *)(lVar16 + 0x8c4));
        mpp_frame_set_hor_stride(s,*(RK_U32 *)(lVar16 + 0x8c8));
        mpp_frame_set_ver_stride(s,*(RK_U32 *)(lVar16 + 0x8cc));
        mpp_frame_set_pts(s,*(RK_S64 *)((long)ctx + 0x38));
        if (*(int *)((long)ctx + 0x40) != 0) {
          mpp_frame_set_eos(s,1);
        }
        mpp_buf_slot_get_unused(slots,&_out);
        *(RK_S32 *)((long)ctx + 0x10) = _out;
        if ((jpegd_debug & 0x20) != 0) {
          _mpp_log_l(4,"jpegd_parser","frame_slot_index:%d\n",(char *)0x0);
        }
        local_34 = 2;
        mpp_slots_set_prop(slots,SLOTS_NUMERATOR,&local_34);
        local_34 = 1;
        mpp_slots_set_prop(slots,SLOTS_DENOMINATOR,&local_34);
        MVar7 = mpp_buf_slot_set_prop(slots,_out,SLOT_FRAME,s);
        if (MVar7 != MPP_OK) {
          return MPP_ERR_VALUE;
        }
        mpp_buf_slot_set_flag(slots,_out,SLOT_CODEC_USE);
        mpp_buf_slot_set_flag(slots,_out,SLOT_HAL_OUTPUT);
      }
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_allocate_frame");
      }
      (local_50->syntax).data = *(void **)((long)ctx + 0x68);
      (local_50->syntax).number = 0x930;
      RVar25 = *(RK_S32 *)((long)ctx + 0x10);
      local_50->output = RVar25;
      local_50->valid = 1;
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_update_frame");
        RVar25 = *(RK_S32 *)((long)ctx + 0x10);
      }
      mpp_buf_slot_clr_flag(*(MppBufSlots *)((long)ctx + 8),RVar25,SLOT_CODEC_USE);
      *(undefined4 *)((long)ctx + 0x10) = 0xffffffff;
      MVar7 = MPP_OK;
      if ((jpegd_debug & 1) != 0) {
        MVar7 = MPP_OK;
        _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_update_frame");
      }
      goto LAB_001b2732;
    }
  }
  *(byte *)&local_50->flags = *(byte *)&local_50->flags | 4;
LAB_001b2732:
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_parse");
  }
  return MVar7;
LAB_001b0d37:
  uVar14 = (uint)bVar5;
  if ((jpegd_debug & 2) == 0) {
LAB_001b0d80:
    lVar16 = (long)pRVar3 - ((long)pvVar8 + 2);
    ctx = local_a8;
  }
  else {
    _mpp_log_l(4,"jpegd_parser","find_marker skipped %d bytes\n",(char *)0x0);
    ctx = local_a8;
    if ((jpegd_debug & 2) == 0) goto LAB_001b0d80;
    lVar16 = (long)pRVar3 - ((long)pvVar8 + 2);
    _mpp_log_l(4,"jpegd_parser","marker = 0x%x, avail_size_in_buf = %d\n",(char *)0x0,(ulong)uVar14,
               lVar16);
  }
  pRVar23 = (RK_U8 *)((long)pvVar8 + 2);
  *(uint *)((long)ctx + 0x58) = uVar14;
  mpp_set_bitread_ctx(local_40,pRVar23,(RK_S32)lVar16);
  if (((bVar5 & 0xf8) == 0xd0) && ((jpegd_debug & 0x40) != 0)) {
    _mpp_log_l(4,"jpegd_parser","restart marker: %d\n",(char *)0x0);
  }
  if (bVar5 != 0xc4 && (byte)(bVar5 + 0x3f) < 0xf) {
    pcVar11 = "Only baseline DCT is supported, unsupported entropy encoding 0x%x";
    pcVar12 = "jpegd_decode_frame";
    iVar22 = 2;
    goto LAB_001b22d3;
  }
  switch(bVar5) {
  case 0xd8:
    *(undefined2 *)(local_b0 + 0x929) = 0;
    *(undefined4 *)(local_b0 + 0x89e) = 0;
    lVar16 = local_b0;
    goto LAB_001b16b3;
  case 0xd9:
    *(undefined1 *)(local_b0 + 0x89f) = 1;
    if ((jpegd_debug & 2) == 0) {
LAB_001b23cf:
      pBVar21 = (BitReadCtx_t *)0x0;
      lVar16 = local_b0;
      goto LAB_001b1f8b;
    }
    _mpp_log_l(4,"jpegd_parser","still exists %d bytes behind EOI marker\n",(char *)0x0);
LAB_001b25e0:
    pBVar21 = (BitReadCtx_t *)0x0;
    lVar16 = local_b0;
LAB_001b1f8b:
    if (*(char *)(lVar16 + 0x89e) == '\0') {
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","sorry, DHT is not found!\n",(char *)0x0);
      }
      local_98 = pBVar21;
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_setup_default_dht");
      }
      lVar28 = *(long *)((long)local_a8 + 0x68);
      lVar16 = lVar28 + 0x240;
      lVar19 = lVar28 + 0x200;
      for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
        puVar1 = (&PTR_jpegd_setup_default_dht_bits_ac_luminance_002f43a0)[lVar18];
        puVar2 = (&PTR_jpegd_setup_default_dht_val_ac_luminance_002f43c0)[lVar18];
        uVar30 = 0;
        for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
          bVar5 = puVar1[lVar29];
          *(uint *)(lVar19 + lVar29 * 4) = (uint)bVar5;
          uVar30 = (ulong)((int)uVar30 + (uint)bVar5);
        }
        *(int *)(lVar18 * 0x2cc + lVar28 + 0x200 + 0x2c8) = (int)uVar30;
        for (uVar26 = 0; uVar30 != uVar26; uVar26 = uVar26 + 1) {
          *(uint *)(lVar16 + uVar26 * 4) = (uint)(byte)puVar2[uVar26];
        }
        lVar19 = lVar19 + 0x2cc;
        lVar16 = lVar16 + 0x2cc;
      }
      lVar19 = lVar28 + 0x7d8;
      lVar16 = lVar28 + 0x798;
      for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
        puVar1 = (&PTR_jpegd_setup_default_dht_bits_dc_luminance_002f43b0)[lVar18];
        puVar2 = (&PTR_jpegd_setup_default_dht_val_dc_002f43d0)[lVar18];
        uVar30 = 0;
        for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
          bVar5 = puVar1[lVar29];
          *(uint *)(lVar16 + lVar29 * 4) = (uint)bVar5;
          uVar30 = (ulong)((int)uVar30 + (uint)bVar5);
        }
        *(int *)(lVar18 * 0x74 + lVar28 + 0x798 + 0x70) = (int)uVar30;
        for (uVar26 = 0; uVar30 != uVar26; uVar26 = uVar26 + 1) {
          *(uint *)(lVar19 + uVar26 * 4) = (uint)(byte)puVar2[uVar26];
        }
        lVar16 = lVar16 + 0x74;
        lVar19 = lVar19 + 0x74;
      }
      if ((jpegd_debug & 1) != 0) {
        _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_setup_default_dht");
      }
      *(undefined1 *)(local_b0 + 0x92a) = 0xf;
      lVar16 = local_b0;
      pBVar21 = local_98;
    }
    MVar7 = (MPP_RET)pBVar21;
    if (*(char *)(lVar16 + 0x8a0) == '\0') {
      _mpp_log_l(2,"jpegd_parser","sof marker not found!\n","jpegd_decode_frame");
      MVar7 = MPP_ERR_STREAM;
    }
    pRVar3 = local_60;
    if (*(char *)(lVar16 + 0x89f) == '\0') {
      if (pRVar23 < local_60) {
        pRVar23 = (RK_U8 *)memchr(pRVar23,0xffd9,(ulong)(uint)((int)local_58 - (int)pRVar23));
        if (pRVar23 != (RK_U8 *)0x0 && pRVar23 < pRVar3) goto LAB_001b21d5;
      }
      else {
        _mpp_log_l(2,"jpegd_parser","buf ptr %p is overflow the buf end %p.",(char *)0x0,pRVar23,
                   local_60);
      }
      _mpp_log_l(2,"jpegd_parser","EOI marker not found!\n","jpegd_decode_frame");
      MVar7 = MPP_ERR_STREAM;
    }
LAB_001b21d5:
    ctx = local_a8;
    MVar4 = MVar7;
    if ((jpegd_debug & 1) != 0) goto LAB_001b2705;
    goto LAB_001b2724;
  case 0xda:
    if (*(char *)(local_b0 + 0x8a0) == '\0') {
      pcVar12 = "Warning: only support baseline type\n";
      goto LAB_001b2628;
    }
    pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
    lVar28 = *(long *)((long)ctx + 0x68);
    RVar6 = jpegd_read_len(pBVar21);
    if (pBVar21->bytes_left_ < (uint)RVar6) {
      _mpp_log_l(2,"jpegd_parser","len %d is too large\n","jpegd_decode_sos",(ulong)(uint)RVar6);
    }
    else {
      uVar14 = (uint)RVar6;
      *(uint *)(lVar28 + 0x8a4) = uVar14;
      MVar7 = mpp_read_bits(pBVar21,8,&_out);
      pBVar21->ret = MVar7;
      if (MVar7 == MPP_OK) {
        if ((_out & 0xfffffffdU) == 1) {
          if (_out * 2 + 6U == uVar14) {
            *(char *)(lVar28 + 0x8a1) = (char)_out;
            uVar14 = 0;
            local_98 = (BitReadCtx_t *)(ulong)(uint)_out;
            while (uVar14 != (uint)local_98) {
              MVar7 = mpp_read_bits(pBVar21,8,&_out);
              pBVar21->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_001b22df;
              uVar20 = _out - 1;
              if ((jpegd_debug & 2) != 0) {
                _mpp_log_l(4,"jpegd_parser","sos component: %d\n",(char *)0x0,(ulong)uVar20);
              }
              uVar30 = (ulong)*(uint *)(lVar28 + 0x8d0);
              uVar26 = 0;
              do {
                if (uVar30 == uVar26) {
                  pcVar12 = "decode_sos: index(%d) out of components\n";
                  goto LAB_001b2240;
                }
                lVar16 = uVar26 * 4;
                uVar26 = uVar26 + 1;
              } while (uVar20 != *(uint *)(lVar28 + 0x8d4 + lVar16));
              MVar7 = mpp_read_bits(pBVar21,4,&_out);
              pBVar21->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_001b22df;
              uVar30 = (ulong)uVar14;
              *(RK_S32 *)(lVar28 + 0x8f8 + uVar30 * 4) = _out;
              MVar7 = mpp_read_bits(pBVar21,4,&_out);
              pBVar21->ret = MVar7;
              if (MVar7 != MPP_OK) goto LAB_001b22df;
              *(RK_S32 *)(lVar28 + 0x904 + uVar30 * 4) = _out;
              if ((jpegd_debug & 2) != 0) {
                _mpp_log_l(4,"jpegd_parser","component:%d, dc_index:%d, ac_index:%d\n",(char *)0x0,
                           (ulong)uVar20,(ulong)*(uint *)(lVar28 + 0x8f8 + uVar30 * 4),
                           (ulong)(uint)_out);
              }
              if ((1 < *(uint *)(lVar28 + 0x8f8 + uVar30 * 4)) ||
                 (uVar14 = uVar14 + 1, 1 < *(uint *)(lVar28 + 0x904 + uVar30 * 4))) {
                _mpp_log_l(2,"jpegd_parser","Huffman table id error\n","jpegd_decode_sos");
                ctx = local_a8;
                goto LAB_001b224c;
              }
            }
            MVar7 = mpp_read_bits(pBVar21,8,&_out);
            pBVar21->ret = MVar7;
            if (MVar7 == MPP_OK) {
              *(char *)(lVar28 + 0x89a) = (char)_out;
              MVar7 = mpp_read_bits(pBVar21,8,&_out);
              pBVar21->ret = MVar7;
              if (MVar7 == MPP_OK) {
                *(char *)(lVar28 + 0x89b) = (char)_out;
                MVar7 = mpp_read_bits(pBVar21,4,&_out);
                pBVar21->ret = MVar7;
                if (MVar7 == MPP_OK) {
                  *(char *)(lVar28 + 0x89c) = (char)_out;
                  MVar7 = mpp_read_bits(pBVar21,4,&_out);
                  pRVar3 = local_48;
                  ctx = local_a8;
                  lVar16 = local_b0;
                  pBVar21->ret = MVar7;
                  if (MVar7 == MPP_OK) {
                    *(byte *)(lVar28 + 0x89d) = (byte)_out;
                    uVar30 = (ulong)*(byte *)(lVar28 + 0x89a);
                    bVar5 = *(byte *)(lVar28 + 0x89b);
                    if (*(byte *)(lVar28 + 0x89a) == 0) {
                      uVar30 = 0;
                      cVar10 = *(char *)(lVar28 + 0x89c);
                      if (((bVar5 == 0x3f) && (bVar5 = 0x3f, cVar10 == '\0')) && ((byte)_out == 0))
                      {
                        uVar14 = ((int)pRVar23 - (int)local_48) + *(int *)(local_b0 + 0x8a4);
                        *(uint *)(local_b0 + 0x8a8) = uVar14;
                        *(RK_U8 **)(local_b0 + 0x8b0) = local_48 + uVar14;
                        uVar20 = *(uint *)((long)local_a8 + 0x20);
                        *(uint *)(local_b0 + 0x8b8) = uVar20;
                        if ((jpegd_debug & 2) != 0) {
                          sVar9 = mpp_packet_get_size(*(MppPacket *)((long)local_a8 + 0x28));
                          _mpp_log_l(4,"jpegd_parser",
                                     "This packet owns %d bytes with length %zu\n\t\thas been decoded %d bytes by software\n\t\tbuf_ptr:%p, buf:%p, sos_len:%d\n\t\thardware start address:%p"
                                     ,(char *)0x0,sVar9,(ulong)*(uint *)(lVar16 + 0x8b8),
                                     (ulong)*(uint *)(lVar16 + 0x8a8),pRVar23,pRVar3,
                                     (ulong)*(uint *)(lVar16 + 0x8a4),
                                     *(undefined8 *)(lVar16 + 0x8b0));
                          uVar14 = *(uint *)(lVar16 + 0x8a8);
                          uVar20 = *(uint *)((long)ctx + 0x20);
                        }
                        if (uVar20 <= uVar14) {
                          _mpp_log_l(2,"jpegd_parser",
                                     "stream offset %d is larger than buffer size %d\n",
                                     "jpegd_decode_frame");
                          goto LAB_001b26f3;
                        }
                        if (((uVar14 + 2 < uVar20) && (pRVar23[*(uint *)(lVar16 + 0x8a4)] == 0xff))
                           && (pRVar23[*(uint *)(lVar16 + 0x8a4) + 1] == 0xd8)) {
                          if ((jpegd_debug & 2) != 0) {
                            _mpp_log_l(4,"jpegd_parser","Encontered SOI again, parse again!\n",
                                       (char *)0x0);
                          }
                          goto LAB_001b16b3;
                        }
                        if (*(int *)((long)ctx + 0x4c) != 0) goto LAB_001b16b3;
                        if ((jpegd_debug & 2) == 0) goto LAB_001b23cf;
                        _mpp_log_l(4,"jpegd_parser","just scan parts of markers!\n",(char *)0x0);
                        goto LAB_001b25e0;
                      }
                    }
                    else {
                      cVar10 = *(char *)(lVar28 + 0x89c);
                    }
                    _mpp_log_l(2,"jpegd_parser",
                               "unsupported sos parameter: scan_start:%d,\n\t\tscan_end:%d, prev_shift:%d, point_transform:%d\n"
                               ,"jpegd_decode_sos",uVar30,(ulong)bVar5,cVar10,(ulong)(byte)_out);
                    goto LAB_001b224c;
                  }
                }
              }
            }
            goto LAB_001b22df;
          }
          _mpp_log_l(2,"jpegd_parser","decode_sos: invalid len (%d), nb_components:%d\n",
                     "jpegd_decode_sos",(ulong)uVar14);
          ctx = local_a8;
        }
        else {
          pcVar12 = "decode_sos: nb_components %d unsupported\n";
          uVar30 = (ulong)(uint)_out;
LAB_001b2240:
          _mpp_log_l(2,"jpegd_parser",pcVar12,"jpegd_decode_sos",uVar30);
          ctx = local_a8;
        }
      }
      else {
LAB_001b22df:
        ctx = local_a8;
        if ((jpegd_debug & 0x40) != 0) {
          _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
        }
      }
    }
LAB_001b224c:
    pcVar12 = "sos decode error\n";
LAB_001b2628:
    _mpp_log_l(2,"jpegd_parser",pcVar12,"jpegd_decode_frame");
    goto LAB_001b26f3;
  case 0xdb:
    pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
    local_88 = *(long *)((long)ctx + 0x68);
    RVar6 = jpegd_read_len(pBVar21);
    uVar14 = RVar6 - 2;
    local_98 = pBVar21;
    if (pBVar21->bytes_left_ < uVar14) {
      _mpp_log_l(2,"jpegd_parser","dqt: len %d is too large\n","jpegd_decode_dqt");
LAB_001b2215:
      pcVar12 = "quantize tables decode error\n";
      goto LAB_001b2628;
    }
    while (pBVar21 = local_98, lVar16 = local_b0, 0x40 < uVar14) {
      local_68 = CONCAT44(local_68._4_4_,uVar14);
      MVar7 = mpp_read_bits(local_98,4,&_out);
      pBVar24 = local_98;
      pBVar21->ret = MVar7;
      RVar25 = (RK_S32)uVar30;
      if (MVar7 == MPP_OK) {
        RVar25 = _out;
      }
      local_70 = CONCAT44(local_70._4_4_,RVar25);
      if (MVar7 != MPP_OK) {
LAB_001b21ef:
        if ((jpegd_debug & 0x40) != 0) {
          pcVar12 = "bit read error!\n";
          iVar22 = 4;
          pcVar11 = (char *)0x0;
LAB_001b220e:
          _mpp_log_l(iVar22,"jpegd_parser",pcVar12,pcVar11);
        }
        goto LAB_001b2215;
      }
      uVar13 = (ushort)_out;
      if (1 < uVar13) {
        pcVar12 = "dqt: invalid precision\n";
LAB_001b2380:
        pcVar11 = "jpegd_decode_dqt";
        iVar22 = 2;
        goto LAB_001b220e;
      }
      MVar7 = mpp_read_bits(local_98,4,&_out);
      pBVar24->ret = MVar7;
      lVar16 = (long)_out;
      local_80 = lVar16;
      if (MVar7 != MPP_OK) goto LAB_001b21ef;
      if (3 < _out) {
        pcVar12 = "dqt: invalid quantize tables ID\n";
        goto LAB_001b2380;
      }
      local_9c = _out;
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","quantize tables ID=%d\n",(char *)0x0,(ulong)(uint)_out);
      }
      local_78 = lVar16 * 0x80;
      lVar16 = local_88 + local_78;
      for (lVar28 = 0; pBVar21 = local_98, lVar28 != 0x40; lVar28 = lVar28 + 1) {
        MVar7 = mpp_read_bits(local_98,(uint)(uVar13 != 0) * 8 + 8,&_out);
        pBVar21->ret = MVar7;
        if (MVar7 != MPP_OK) goto LAB_001b21ef;
        *(short *)(lVar16 + lVar28 * 2) = (short)_out;
      }
      bVar5 = *(char *)(local_88 + 0x929) + 1;
      *(byte *)(local_88 + 0x929) = bVar5;
      if (3 < bVar5) {
        _mpp_log_l(2,"jpegd_parser","%d entries qtbl is not supported\n","jpegd_decode_dqt",
                   (ulong)bVar5);
      }
      if ((jpegd_debug & 4) != 0) {
        _mpp_log_l(4,"jpegd_parser","******Start to print quantize table %d******\n",(char *)0x0,
                   (ulong)local_9c);
        for (uVar30 = 0; pvVar8 = local_a8, uVar30 < 0x40; uVar30 = uVar30 + 8) {
          local_90 = (ulong)*(ushort *)(lVar16 + uVar30 * 2);
          uVar26 = (ulong)*(ushort *)(lVar16 + 0xe + uVar30 * 2);
          _mpp_log_l(4,"jpegd_parser",
                     "%2d~%2d 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x\n",
                     (char *)0x0,uVar30 & 0xffffffff,(ulong)((int)uVar30 + 7),local_90,
                     (ulong)*(ushort *)(lVar16 + 2 + uVar30 * 2),
                     (ulong)*(ushort *)(lVar16 + 4 + uVar30 * 2),
                     (ulong)*(ushort *)(lVar16 + 6 + uVar30 * 2),
                     (ulong)*(ushort *)(lVar16 + 8 + uVar30 * 2),
                     (ulong)*(ushort *)(lVar16 + 10 + uVar30 * 2),uVar26,uVar26);
          ctx = pvVar8;
        }
        _mpp_log_l(4,"jpegd_parser","******Quantize table %d End******\n",(char *)0x0,
                   (ulong)local_9c);
      }
      uVar13 = *(ushort *)(local_88 + 2 + local_78);
      uVar14 = *(uint *)(local_88 + 0x10 + local_78);
      if ((ushort)uVar14 < uVar13) {
        uVar14 = (uint)uVar13;
      }
      *(int *)(local_88 + 0x880 + local_80 * 4) = (int)(((ulong)uVar14 & 0xffff) >> 1);
      iVar22 = (int)local_70;
      uVar30 = local_70 & 0xffffffff;
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","qscale[%d]: %d\n",(char *)0x0,(ulong)local_9c);
      }
      uVar14 = (int)local_68 - (iVar22 * 0x40 + 0x41U & 0xffff);
    }
    goto LAB_001b16b3;
  case 0xdc:
    goto switchD_001b0e2d_caseD_dc;
  case 0xdd:
    pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
    lVar28 = *(long *)((long)ctx + 0x68);
    RVar6 = jpegd_read_len(pBVar21);
    if (RVar6 == 4) {
      MVar7 = mpp_read_bits(pBVar21,0x10,&_out);
      lVar16 = local_b0;
      pBVar21->ret = MVar7;
      if (MVar7 == MPP_OK) {
        *(RK_S32 *)(lVar28 + 0x924) = _out;
        if ((jpegd_debug & 2) != 0) {
          _mpp_log_l(4,"jpegd_parser","restart interval: %d\n",(char *)0x0);
        }
        goto LAB_001b16b3;
      }
      if ((jpegd_debug & 0x40) != 0) {
        _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
      }
    }
    else {
      _mpp_log_l(2,"jpegd_parser","DRI length %d error\n","jpegd_decode_dri",(ulong)RVar6);
    }
    pcVar12 = "dri decode error\n";
    goto LAB_001b2628;
  }
  if (bVar5 == 0xc0) {
    pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
    lVar28 = *(long *)((long)ctx + 0x68);
    RVar6 = jpegd_read_len(pBVar21);
    if (pBVar21->bytes_left_ < (uint)RVar6) {
      pcVar12 = "len %d is too large\n";
      uVar30 = (ulong)(uint)RVar6;
LAB_001b25b4:
      _mpp_log_l(2,"jpegd_parser",pcVar12,"jpegd_decode_sof",uVar30);
    }
    else {
      MVar7 = mpp_read_bits(pBVar21,8,&_out);
      pBVar21->ret = MVar7;
      if (MVar7 == MPP_OK) {
        uVar30 = (ulong)(uint)_out;
        if (_out - 0x11U < 0xfffffff0) {
          pcVar12 = "bits %d is invalid\n";
          goto LAB_001b25b4;
        }
        *(char *)(lVar28 + 0x928) = (char)_out;
        MVar7 = mpp_read_bits(pBVar21,0x10,&_out);
        RVar25 = _out;
        pBVar21->ret = MVar7;
        if (MVar7 == MPP_OK) {
          MVar7 = mpp_read_bits(pBVar21,0x10,&_out);
          pBVar21->ret = MVar7;
          if (MVar7 == MPP_OK) {
            *(RK_S32 *)(lVar28 + 0x8c4) = RVar25;
            *(RK_S32 *)(lVar28 + 0x8c0) = _out;
            uVar14 = _out + 0xfU & 0xfffffff0;
            *(uint *)(lVar28 + 0x8c8) = uVar14;
            uVar20 = RVar25 + 0xfU & 0xfffffff0;
            *(uint *)(lVar28 + 0x8cc) = uVar20;
            if ((jpegd_debug & 2) != 0) {
              _mpp_log_l(4,"jpegd_parser","sof0: picture: %dx%d, stride: %dx%d\n",(char *)0x0,
                         (ulong)(uint)_out,(ulong)(uint)RVar25,(ulong)uVar14,(ulong)uVar20);
            }
            MVar7 = mpp_read_bits(pBVar21,8,&_out);
            RVar25 = _out;
            pBVar21->ret = MVar7;
            if (MVar7 == MPP_OK) {
              uVar26 = (ulong)(uint)_out;
              if ((_out & 0xfffffffdU) != 1) {
                pcVar12 = "components number %d error\n";
                uVar30 = (ulong)(uint)_out;
                goto LAB_001b25b4;
              }
              if (_out * 3 + 8U != (uint)RVar6) {
                _mpp_log_l(2,"jpegd_parser",
                           "decode_sof0: error, len(%d) mismatch nb_components(%d)\n",
                           "jpegd_decode_sof",(ulong)(uint)RVar6,(ulong)(uint)_out);
              }
              *(RK_S32 *)(lVar28 + 0x8d0) = RVar25;
              *(undefined8 *)(lVar28 + 0x910) = 0x100000001;
              for (uVar17 = 0; ctx = local_a8, lVar16 = local_b0, uVar26 != uVar17;
                  uVar17 = uVar17 + 1) {
                MVar7 = mpp_read_bits(pBVar21,8,&_out);
                pBVar21->ret = MVar7;
                if (MVar7 != MPP_OK) goto LAB_001b26a9;
                *(RK_S32 *)(lVar28 + 0x8d4 + uVar17 * 4) = _out + -1;
                MVar7 = mpp_read_bits(pBVar21,4,&_out);
                pBVar21->ret = MVar7;
                if (MVar7 != MPP_OK) goto LAB_001b26a9;
                *(RK_S32 *)(lVar28 + 0x8e0 + uVar17 * 4) = _out;
                MVar7 = mpp_read_bits(pBVar21,4,&_out);
                pBVar21->ret = MVar7;
                if (MVar7 != MPP_OK) goto LAB_001b26a9;
                *(RK_S32 *)(lVar28 + 0x8ec + uVar17 * 4) = _out;
                uVar14 = *(uint *)(lVar28 + 0x8e0 + uVar17 * 4);
                if ((uVar14 == 0) || (_out == 0)) {
                  _mpp_log_l(2,"jpegd_parser","Invalid sampling factor in component %d %d:%d\n",
                             "jpegd_decode_sof",uVar17 & 0xffffffff,(ulong)uVar14,(ulong)(uint)_out)
                  ;
                  goto LAB_001b26cf;
                }
                uVar20 = _out;
                if (*(uint *)(lVar28 + 0x910) < uVar14) {
                  *(uint *)(lVar28 + 0x910) = uVar14;
                  uVar20 = *(uint *)(lVar28 + 0x8ec + uVar17 * 4);
                }
                if (*(uint *)(lVar28 + 0x914) < uVar20) {
                  *(uint *)(lVar28 + 0x914) = uVar20;
                }
                MVar7 = mpp_read_bits(pBVar21,8,&_out);
                pBVar21->ret = MVar7;
                if (MVar7 != MPP_OK) goto LAB_001b26a9;
                uVar30 = (ulong)(uint)_out;
                *(RK_S32 *)(lVar28 + 0x918 + uVar17 * 4) = _out;
                if (3 < (uint)_out) {
                  pcVar12 = "quant_index %d is invalid\n";
                  goto LAB_001b25b4;
                }
                if ((jpegd_debug & 2) != 0) {
                  _mpp_log_l(4,"jpegd_parser","component %d %d:%d id: %d quant_id:%d\n",(char *)0x0,
                             uVar17 & 0xffffffff,(ulong)*(uint *)(lVar28 + 0x8e0 + uVar17 * 4),
                             (ulong)*(uint *)(lVar28 + 0x8ec + uVar17 * 4),
                             (ulong)*(uint *)(lVar28 + 0x8d4 + uVar17 * 4),uVar30);
                }
              }
              lVar28 = *(long *)((long)local_a8 + 0x68);
              if (*(int *)(lVar28 + 0x8d0) == 1) {
                if ((*(int *)(lVar28 + 0x8e0) != 0) &&
                   (*(int *)(lVar28 + 0x8e0) == *(int *)(lVar28 + 0x8ec))) {
                  *(undefined8 *)(lVar28 + 0x890) = 0xc;
                  if ((*(uint *)(lVar28 + 0x8c0) & 0xf) - 1 < 8) {
                    *(undefined1 *)(lVar28 + 0x899) = 1;
                  }
LAB_001b1d20:
                  uVar14 = *(uint *)(lVar28 + 0x8c4);
joined_r0x001b1d2f:
                  if ((uVar14 & 0xf) - 1 < 8) {
                    *(undefined1 *)(lVar28 + 0x898) = 1;
                  }
LAB_001b1d39:
                  bVar5 = *(byte *)(*(long *)((long)ctx + 0x68) + 0x928);
                  uVar30 = (ulong)bVar5;
                  if (bVar5 == 8) {
                    *(undefined1 *)(lVar16 + 0x8a0) = 1;
                    goto LAB_001b16b3;
                  }
                  pcVar11 = 
                  "Illegal sample precision %d.\n                    For baseline, it should be 8\n"
                  ;
                  pcVar12 = "jpegd_decode_frame";
                  iVar22 = 2;
                  goto LAB_001b22d3;
                }
                _mpp_log_l(2,"jpegd_parser","unsupported format(%d*%d)\n","jpeg_judge_yuv_mode");
              }
              else if (*(int *)(lVar28 + 0x8d0) == 3) {
                uVar14 = *(uint *)(lVar28 + 0x8e0);
                uVar20 = *(uint *)(lVar28 + 0x8ec);
                uVar30 = (ulong)uVar20;
                if (uVar14 == 1) {
                  if (uVar20 == 1) {
                    if ((((*(int *)(lVar28 + 0x8e4) == 1) && (*(int *)(lVar28 + 0x8f0) == 1)) &&
                        (*(int *)(lVar28 + 0x8e8) == 1)) && (*(int *)(lVar28 + 0x8f4) == 1)) {
                      if ((jpegd_debug & 2) != 0) {
                        _mpp_log_l(4,"jpegd_parser","YCbCr Format: YUV444(1*1:1*1:1*1)\n",
                                   (char *)0x0);
                      }
                      *(undefined8 *)(lVar28 + 0x890) = 0x40000000f;
                      if ((*(uint *)(lVar28 + 0x8c0) & 0xf) - 1 < 8) {
                        *(undefined1 *)(lVar28 + 0x899) = 1;
                      }
                      uVar14 = *(uint *)(lVar28 + 0x8c4);
                      lVar16 = local_b0;
                      ctx = local_a8;
                      goto joined_r0x001b1d2f;
                    }
LAB_001b263e:
                    uVar30 = 1;
                  }
                  else if (uVar20 == 2) {
                    if (((*(int *)(lVar28 + 0x8e4) == 1) && (*(int *)(lVar28 + 0x8f0) == 1)) &&
                       ((*(int *)(lVar28 + 0x8e8) == 1 && (*(int *)(lVar28 + 0x8f4) == 1)))) {
                      if ((jpegd_debug & 2) != 0) {
                        _mpp_log_l(4,"jpegd_parser","YCbCr Format: YUV440(1*2:1*1:1*1)\n",
                                   (char *)0x0);
                      }
                      *(undefined8 *)(lVar28 + 0x890) = 0x50000000d;
                      lVar16 = local_b0;
                      if ((*(uint *)(lVar28 + 0x8c0) & 0xf) - 1 < 8) {
                        *(undefined1 *)(lVar28 + 0x899) = 1;
                      }
                      goto LAB_001b1d39;
                    }
LAB_001b265f:
                    uVar30 = 2;
                  }
                }
                else if (uVar14 == 4) {
                  if (uVar20 == 1) {
                    if (((*(int *)(lVar28 + 0x8e4) == 1) && (*(int *)(lVar28 + 0x8f0) == 1)) &&
                       ((*(int *)(lVar28 + 0x8e8) == 1 && (*(int *)(lVar28 + 0x8f4) == 1)))) {
                      if ((jpegd_debug & 2) != 0) {
                        _mpp_log_l(4,"jpegd_parser","YCbCr Format: YUV411(4*1:1*1:1*1)\n",
                                   (char *)0x0);
                      }
                      *(undefined8 *)(lVar28 + 0x890) = 0x60000000e;
                      goto LAB_001b1d20;
                    }
                    goto LAB_001b263e;
                  }
                }
                else if (uVar14 == 2) {
                  if (uVar20 == 1) {
                    if ((((*(int *)(lVar28 + 0x8e4) == 1) && (*(int *)(lVar28 + 0x8f0) == 1)) &&
                        (*(int *)(lVar28 + 0x8e8) == 1)) && (*(int *)(lVar28 + 0x8f4) == 1)) {
                      if ((jpegd_debug & 2) != 0) {
                        _mpp_log_l(4,"jpegd_parser","YCbCr Format: YUV422(2*1:1*1:1*1)\n",
                                   (char *)0x0);
                      }
                      *(undefined8 *)(lVar28 + 0x890) = 0x300000002;
                      uVar14 = *(uint *)(lVar28 + 0x8c4);
                      lVar16 = local_b0;
                      goto joined_r0x001b1d2f;
                    }
                    goto LAB_001b263e;
                  }
                  if (uVar20 == 2) {
                    if (((*(int *)(lVar28 + 0x8e4) != 1) || (*(int *)(lVar28 + 0x8f0) != 1)) ||
                       ((*(int *)(lVar28 + 0x8e8) != 1 || (*(int *)(lVar28 + 0x8f4) != 1))))
                    goto LAB_001b265f;
                    if ((jpegd_debug & 2) != 0) {
                      _mpp_log_l(4,"jpegd_parser","YCbCr Format: YUV420(2*2:1*1:1*1)\n",(char *)0x0)
                      ;
                    }
                    *(undefined8 *)(lVar28 + 0x890) = 0x200000000;
                    lVar16 = local_b0;
                    goto LAB_001b1d39;
                  }
                }
                _mpp_log_l(2,"jpegd_parser","Unsupported YCbCr Format: (%d*%d:%d*%d:%d*%d)\n",
                           "jpeg_judge_yuv_mode",(ulong)uVar14,uVar30,
                           (ulong)*(uint *)(lVar28 + 0x8e4),(ulong)*(uint *)(lVar28 + 0x8f0),
                           (ulong)*(uint *)(lVar28 + 0x8e8),(ulong)*(uint *)(lVar28 + 0x8f4));
              }
              else {
                _mpp_log_l(2,"jpegd_parser","unsupported format, nb_components=%d\n",
                           "jpeg_judge_yuv_mode");
              }
            }
          }
        }
      }
LAB_001b26a9:
      if ((jpegd_debug & 0x40) != 0) {
        _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
      }
    }
LAB_001b26cf:
    _mpp_log_l(2,"jpegd_parser","sof0 decode error\n","jpegd_decode_frame");
    ctx = local_a8;
    goto LAB_001b26f3;
  }
  if (uVar14 == 0xc4) {
    pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
    lVar16 = *(long *)((long)ctx + 0x68);
    RVar6 = jpegd_read_len(pBVar21);
    uVar14 = RVar6 - 2;
    uVar30 = (ulong)uVar14;
    if (pBVar21->bytes_left_ < uVar14) {
      _mpp_log_l(2,"jpegd_parser","dht: len %d is too large\n","jpegd_decode_dht",(ulong)uVar14);
LAB_001b261a:
      pcVar12 = "huffman table decode error\n";
      goto LAB_001b2628;
    }
    if ((jpegd_debug & 2) != 0) {
      _mpp_log_l(4,"jpegd_parser","dht: huffman tables length=%d\n",(char *)0x0);
    }
    local_88 = lVar16 + 0x200;
    local_68 = lVar16 + 0x798;
    local_70 = lVar16 + 0x240;
    local_90 = lVar16 + 0x7d8;
    local_80 = lVar16;
    local_78 = local_90;
    while (uVar14 = (uint)uVar30, uVar14 != 0) {
      if (uVar14 < 0x11) {
        pcVar12 = "dht: len %d is too small\n";
LAB_001b252f:
        _mpp_log_l(2,"jpegd_parser",pcVar12,"jpegd_decode_dht",uVar30);
        ctx = local_a8;
        goto LAB_001b261a;
      }
      MVar7 = mpp_read_bits(pBVar21,4,&_out);
      RVar25 = _out;
      pBVar21->ret = MVar7;
      if (MVar7 != MPP_OK) {
LAB_001b225f:
        ctx = local_a8;
        if ((jpegd_debug & 0x40) != 0) {
          _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
        }
        goto LAB_001b261a;
      }
      if (1 < (uint)_out) {
        pcVar12 = "table type %d error\n";
        uVar30 = (ulong)(uint)_out;
        goto LAB_001b252f;
      }
      local_9c = _out;
      MVar7 = mpp_read_bits(pBVar21,4,&_out);
      pBVar21->ret = MVar7;
      uVar30 = (ulong)(uint)_out;
      local_90 = local_90 & 0xffffffff;
      if (MVar7 != MPP_OK) goto LAB_001b225f;
      local_90 = uVar30;
      if (1 < (uint)_out) {
        pcVar12 = "table id %d is unsupported for baseline\n";
        goto LAB_001b252f;
      }
      if (RVar25 == 0) {
        lVar16 = uVar30 * 0x74 + local_68;
        pBVar24 = (BitReadCtx_t *)0x0;
        for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
          MVar7 = mpp_read_bits(pBVar21,8,&_out);
          pBVar21->ret = MVar7;
          if (MVar7 != MPP_OK) goto LAB_001b225f;
          *(RK_S32 *)(lVar16 + lVar28 * 4) = _out;
          pBVar24 = (BitReadCtx_t *)(ulong)(uint)((int)pBVar24 + _out);
        }
        *(int *)(lVar16 + 0x70) = (int)pBVar24;
      }
      else {
        lVar16 = uVar30 * 0x2cc + local_88;
        pBVar24 = (BitReadCtx_t *)0x0;
        for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
          MVar7 = mpp_read_bits(pBVar21,8,&_out);
          pBVar21->ret = MVar7;
          if (MVar7 != MPP_OK) goto LAB_001b225f;
          *(RK_S32 *)(lVar16 + lVar28 * 4) = _out;
          pBVar24 = (BitReadCtx_t *)(ulong)(uint)((int)pBVar24 + _out);
        }
        *(int *)(lVar16 + 0x2c8) = (int)pBVar24;
      }
      uVar20 = (uint)pBVar24;
      uVar30 = (ulong)((uVar14 - 0x11) - uVar20);
      if ((uVar14 - 0x11 < uVar20) || (RVar25 == 0 && 0xc < uVar20)) {
        uVar30 = (ulong)local_9c;
LAB_001b25f3:
        _mpp_log_l(2,"jpegd_parser","table type %d, code word number %d error\n","jpegd_decode_dht",
                   uVar30,pBVar24);
        ctx = local_a8;
        goto LAB_001b261a;
      }
      if ((0xa2 < uVar20) && (local_9c == 1)) {
        uVar30 = 1;
        goto LAB_001b25f3;
      }
      bVar5 = (char)local_90 * '\x02';
      local_98 = pBVar24;
      if (RVar25 == 0) {
        *(byte *)(local_80 + 0x92a) = *(byte *)(local_80 + 0x92a) | (byte)(1 << (bVar5 & 0x1f));
        lVar16 = (local_90 & 0xffffffff) * 0x74 + local_78;
        uVar26 = 0;
        for (pBVar15 = (BitReadCtx_t *)0x0; local_98 != pBVar15;
            pBVar15 = (BitReadCtx_t *)((long)&pBVar15->data_ + 1)) {
          MVar7 = mpp_read_bits(pBVar21,8,&_out);
          pBVar21->ret = MVar7;
          if (MVar7 != MPP_OK) goto LAB_001b225f;
          *(RK_S32 *)(lVar16 + (long)pBVar15 * 4) = _out;
          if ((uint)uVar26 < (uint)_out) {
            uVar26 = (ulong)(uint)_out;
          }
        }
      }
      else {
        *(byte *)(local_80 + 0x92a) = *(byte *)(local_80 + 0x92a) | (byte)(2 << (bVar5 & 0x1f));
        lVar16 = (local_90 & 0xffffffff) * 0x2cc + local_70;
        uVar26 = 0;
        for (pBVar15 = (BitReadCtx_t *)0x0; local_98 != pBVar15;
            pBVar15 = (BitReadCtx_t *)((long)&pBVar15->data_ + 1)) {
          MVar7 = mpp_read_bits(pBVar21,8,&_out);
          pBVar21->ret = MVar7;
          if (MVar7 != MPP_OK) goto LAB_001b225f;
          *(RK_S32 *)(lVar16 + (long)pBVar15 * 4) = _out;
          if ((uint)uVar26 < (uint)_out) {
            uVar26 = (ulong)(uint)_out;
          }
        }
      }
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","dht: type=%d id=%d code_word_num=%d, code_max=%d, len=%d\n",
                   (char *)0x0,(ulong)local_9c,local_90,pBVar24,uVar26,uVar30);
      }
    }
    *(undefined1 *)(local_b0 + 0x89e) = 1;
    lVar16 = local_b0;
    ctx = local_a8;
    goto LAB_001b16b3;
  }
switchD_001b0e2d_caseD_dc:
  if ((jpegd_debug & 2) != 0) {
    _mpp_log_l(4,"jpegd_parser","unhandled coding type(0x%x) in switch..case..\n",(char *)0x0);
  }
  lVar16 = local_b0;
  pBVar21 = *(BitReadCtx_t **)((long)ctx + 0x60);
  if (((1 < pBVar21->bytes_left_) && (RVar6 = jpegd_read_len(pBVar21), 1 < RVar6)) &&
     (RVar6 - 2 <= pBVar21->bytes_left_)) {
    if (RVar6 == 2) {
LAB_001b16b3:
      pRVar23 = (RK_U8 *)**(undefined8 **)((long)ctx + 0x60);
      goto LAB_001b0cb9;
    }
    MVar7 = mpp_skip_longbits(pBVar21,(RVar6 - 2) * 8);
    pBVar21->ret = MVar7;
    if (MVar7 == MPP_OK) goto LAB_001b16b3;
  }
  if ((jpegd_debug & 2) == 0) goto LAB_001b26f3;
  pcVar11 = "Fail to skip section 0xFF%02x!\n";
  iVar22 = 4;
  pcVar12 = (char *)0x0;
LAB_001b22d3:
  _mpp_log_l(iVar22,"jpegd_parser",pcVar11,pcVar12,uVar30);
  goto LAB_001b26f3;
}

Assistant:

static MPP_RET jpegd_parse(void *ctx, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    task->valid = 0;

    JpegCtx->buffer = (RK_U8 *)mpp_packet_get_data(JpegCtx->input_packet);

    memset(JpegCtx->syntax, 0, sizeof(JpegdSyntax));

    ret = jpegd_decode_frame(JpegCtx);
    if (MPP_OK == ret) {
        if (jpegd_allocate_frame(JpegCtx))
            return MPP_ERR_VALUE;

        task->syntax.data = (void *)JpegCtx->syntax;
        task->syntax.number = sizeof(JpegdSyntax);
        task->output = JpegCtx->frame_slot_index;
        task->valid = 1;

        jpegd_update_frame(JpegCtx);
    } else
        task->flags.parse_err = 1;

    jpegd_dbg_func("exit\n");
    return ret;
}